

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void memxor16(void *vout,void *vlhs,void *vrhs)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t w;
  uint8_t *rhs;
  uint8_t *lhs;
  uint8_t *out;
  void *vrhs_local;
  void *vlhs_local;
  void *vout_local;
  
  uVar1 = GET_64BIT_LSB_FIRST(vlhs);
  uVar2 = GET_64BIT_LSB_FIRST(vrhs);
  PUT_64BIT_LSB_FIRST(vout,uVar2 ^ uVar1);
  uVar1 = GET_64BIT_LSB_FIRST((void *)((long)vlhs + 8));
  uVar2 = GET_64BIT_LSB_FIRST((void *)((long)vrhs + 8));
  PUT_64BIT_LSB_FIRST((void *)((long)vout + 8),uVar2 ^ uVar1);
  return;
}

Assistant:

static inline void memxor16(void *vout, const void *vlhs, const void *vrhs)
{
    uint8_t *out = (uint8_t *)vout;
    const uint8_t *lhs = (const uint8_t *)vlhs, *rhs = (const uint8_t *)vrhs;
    uint64_t w;

    w = GET_64BIT_LSB_FIRST(lhs);
    w ^= GET_64BIT_LSB_FIRST(rhs);
    PUT_64BIT_LSB_FIRST(out, w);
    w = GET_64BIT_LSB_FIRST(lhs + 8);
    w ^= GET_64BIT_LSB_FIRST(rhs + 8);
    PUT_64BIT_LSB_FIRST(out + 8, w);
}